

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sumsurface.cpp
# Opt level: O0

bool __thiscall
ON_SumSurface::GetBBox(ON_SumSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  undefined1 local_188 [8];
  ON_BoundingBox bbox;
  int j;
  int dim;
  ON_3dPoint local_138;
  ON_3dPoint local_120;
  ON_3dPoint local_108;
  ON_SumSurface *local_f0;
  ON_SumSurface *pS;
  ON_BoundingBox local_b8;
  undefined1 local_88 [8];
  ON_BoundingBox bboxB;
  ON_BoundingBox bboxA;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_SumSurface *this_local;
  
  bboxA.m_max.z._7_1_ = bGrowBox;
  bboxA.m_max.z._6_1_ = ON_BoundingBox::IsValid(&this->m_bbox);
  if (!(bool)bboxA.m_max.z._6_1_) {
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&bboxB.m_max.z);
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_88);
    if (this->m_curve[0] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_b8,&this->m_curve[0]->super_ON_Geometry);
      memcpy(&bboxB.m_max.z,&local_b8,0x30);
    }
    if (this->m_curve[1] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox((ON_BoundingBox *)&pS,&this->m_curve[1]->super_ON_Geometry);
      memcpy(local_88,&pS,0x30);
    }
    bVar2 = ON_BoundingBox::IsValid((ON_BoundingBox *)&bboxB.m_max.z);
    if ((bVar2) && (bVar2 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_88), bVar2)) {
      local_f0 = this;
      ON_3dPoint::operator+(&local_120,(ON_3dPoint *)&bboxB.m_max.z,(ON_3dPoint *)local_88);
      ON_3dPoint::operator+(&local_108,&local_120,&this->m_basepoint);
      (local_f0->m_bbox).m_min.x = local_108.x;
      (local_f0->m_bbox).m_min.y = local_108.y;
      (local_f0->m_bbox).m_min.z = local_108.z;
      ON_3dPoint::operator+
                ((ON_3dPoint *)&j,(ON_3dPoint *)&bboxA.m_min.z,(ON_3dPoint *)&bboxB.m_min.z);
      ON_3dPoint::operator+(&local_138,(ON_3dPoint *)&j,&this->m_basepoint);
      (local_f0->m_bbox).m_max.x = local_138.x;
      (local_f0->m_bbox).m_max.y = local_138.y;
      (local_f0->m_bbox).m_max.z = local_138.z;
    }
    bboxA.m_max.z._6_1_ = ON_BoundingBox::IsValid(&this->m_bbox);
  }
  if ((bool)bboxA.m_max.z._6_1_ != false) {
    bbox.m_max.z._4_4_ =
         (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_188);
    if ((((bboxA.m_max.z._7_1_ & 1) == 0) || (boxmin == (double *)0x0)) || (boxmax == (double *)0x0)
       ) {
      memcpy(local_188,&this->m_bbox,0x30);
    }
    else {
      for (bbox.m_max.z._0_4_ = 0; bbox.m_max.z._0_4_ < 3 && bbox.m_max.z._0_4_ < bbox.m_max.z._4_4_
          ; bbox.m_max.z._0_4_ = bbox.m_max.z._0_4_ + 1) {
        dVar1 = boxmin[bbox.m_max.z._0_4_];
        pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)local_188,bbox.m_max.z._0_4_);
        *pdVar3 = dVar1;
        dVar1 = boxmax[bbox.m_max.z._0_4_];
        pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&bbox.m_min.z,bbox.m_max.z._0_4_);
        *pdVar3 = dVar1;
      }
      bVar2 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_188);
      if (bVar2) {
        ON_BoundingBox::Union((ON_BoundingBox *)local_188,&this->m_bbox);
      }
      else {
        memcpy(local_188,&this->m_bbox,0x30);
      }
    }
    bbox.m_max.z._4_4_ =
         (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
    for (bbox.m_max.z._0_4_ = 0; bbox.m_max.z._0_4_ < 3 && bbox.m_max.z._0_4_ < bbox.m_max.z._4_4_;
        bbox.m_max.z._0_4_ = bbox.m_max.z._0_4_ + 1) {
      if (boxmin != (double *)0x0) {
        pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)local_188,bbox.m_max.z._0_4_);
        boxmin[bbox.m_max.z._0_4_] = *pdVar3;
      }
      if (boxmax != (double *)0x0) {
        pdVar3 = ON_3dPoint::operator[]((ON_3dPoint *)&bbox.m_min.z,bbox.m_max.z._0_4_);
        boxmax[bbox.m_max.z._0_4_] = *pdVar3;
      }
    }
    for (bbox.m_max.z._0_4_ = 3; bbox.m_max.z._0_4_ < bbox.m_max.z._4_4_;
        bbox.m_max.z._0_4_ = bbox.m_max.z._0_4_ + 1) {
      if (boxmin != (double *)0x0) {
        boxmin[bbox.m_max.z._0_4_] = 0.0;
      }
      if (boxmax != (double *)0x0) {
        boxmax[bbox.m_max.z._0_4_] = 0.0;
      }
    }
  }
  return (bool)(bboxA.m_max.z._6_1_ & 1);
}

Assistant:

bool ON_SumSurface::GetBBox( // returns true if successful
       double* boxmin,    // boxmin[dim]
       double* boxmax,    // boxmax[dim]
       bool bGrowBox
       ) const
{
  bool rc = m_bbox.IsValid();
  if (!rc )
  {
    // lazy bounding box evaluation
    ON_BoundingBox bboxA, bboxB;
    if ( m_curve[0] )
      bboxA = m_curve[0]->BoundingBox();
    if ( m_curve[1] )
      bboxB = m_curve[1]->BoundingBox();
    if ( bboxA.IsValid() && bboxB.IsValid() )
    {
      ON_SumSurface* pS = const_cast<ON_SumSurface*>(this);
      pS->m_bbox.m_min = bboxA.m_min + bboxB.m_min + m_basepoint;
      pS->m_bbox.m_max = bboxA.m_max + bboxB.m_max + m_basepoint;
    }
    rc = m_bbox.IsValid();
  }

  if ( rc )
  {
    int dim = Dimension();
    int j;
    ON_BoundingBox bbox;
    if ( bGrowBox && boxmin && boxmax )
    {
      for ( j = 0; j < 3 && j < dim; j++ )
      {
        bbox.m_min[j] = boxmin[j];
        bbox.m_max[j] = boxmax[j];
      }
      if ( !bbox.IsValid() )
        bbox = m_bbox;
      else
        bbox.Union(m_bbox);
    }
    else
      bbox = m_bbox;
    dim = Dimension();
    for ( j = 0; j < 3 && j < dim; j++ )
    {
      if(boxmin) 
        boxmin[j] = bbox.m_min[j];
      if(boxmax) 
        boxmax[j] = bbox.m_max[j];
    }
    for ( j = 3; j < dim; j++ )
    {
      if (boxmin) 
        boxmin[j] = 0.0;
      if (boxmax) 
        boxmax[j] = 0.0;
    }
  }
  return rc;
}